

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5d835d::FunctionEncoding::printLeft(FunctionEncoding *this,OutputStream *S)

{
  Node *pNVar1;
  int iVar2;
  
  pNVar1 = this->Ret;
  if (pNVar1 != (Node *)0x0) {
    (*pNVar1->_vptr_Node[4])(pNVar1,S);
    pNVar1 = this->Ret;
    if (pNVar1->RHSComponentCache != Yes) {
      if (pNVar1->RHSComponentCache == Unknown) {
        iVar2 = (**pNVar1->_vptr_Node)(pNVar1,S);
        if ((char)iVar2 != '\0') goto LAB_001db451;
      }
      OutputStream::grow(S,1);
      S->Buffer[S->CurrentPosition] = ' ';
      S->CurrentPosition = S->CurrentPosition + 1;
    }
  }
LAB_001db451:
  pNVar1 = this->Name;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache == No) {
    return;
  }
  (*pNVar1->_vptr_Node[5])(pNVar1,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (Ret) {
      Ret->printLeft(S);
      if (!Ret->hasRHSComponent(S))
        S += " ";
    }
    Name->print(S);
  }